

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

const_reference __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::operator[](InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
             *this,size_type i)

{
  ulong uVar1;
  const_reference pCVar2;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if (1 < uVar1) {
    if ((uVar1 & 1) == 0) {
      pCVar2 = (const_reference)&this->rep_;
    }
    else {
      pCVar2 = *(const_reference *)((long)&this->rep_ + 8);
    }
    return pCVar2;
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0xf8,
                "const_reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::operator[](size_type) const [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

size_type size() const { return size_ / 2; }